

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Matrix<double,_3,_3> *
gl4cts::Math::inverse<3>(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *matrix)

{
  tcu *this;
  Matrix<double,_3,_3> *mat;
  double dVar1;
  GLdouble inv_det;
  GLdouble det;
  undefined1 local_a8 [8];
  Matrix<double,_3,_3> adjugate;
  Matrix<double,_3,_3> cof;
  Matrix<double,_3,_3> *matrix_local;
  Matrix<double,_3,_3> *result;
  
  this = (tcu *)(adjugate.m_data.m_data[2].m_data + 2);
  cofactors<3>((Matrix<double,_3,_3> *)this,matrix);
  tcu::transpose<double,3,3>((Matrix<double,_3,_3> *)local_a8,this,mat);
  dVar1 = determinant<double>(matrix);
  tcu::operator*(__return_storage_ptr__,(Matrix<double,_3,_3> *)local_a8,1.0 / dVar1);
  tcu::Matrix<double,_3,_3>::~Matrix((Matrix<double,_3,_3> *)local_a8);
  tcu::Matrix<double,_3,_3>::~Matrix((Matrix<double,_3,_3> *)(adjugate.m_data.m_data[2].m_data + 2))
  ;
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}